

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# centroid_test.cpp
# Opt level: O0

void __thiscall FIND_CountsAll_Test::TestBody(FIND_CountsAll_Test *this)

{
  bool bVar1;
  int iVar2;
  char *message;
  AssertHelper local_70;
  Message local_68 [3];
  pair<int,_int> local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  Graph G;
  int local_18;
  int i;
  int size;
  int runs;
  FIND_CountsAll_Test *this_local;
  
  i = 0x32;
  local_18 = 100;
  _size = this;
  for (G.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      G.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < i;
      G.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           G.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    gen_tree((Graph *)&gtest_ar.message_,local_18);
    iVar2 = rand();
    local_50 = _find_centroid((Graph *)&gtest_ar.message_,iVar2 % local_18,-1,0);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_48,"_find_centroid(G, rand() % size, -1, 0).first","size",
               &local_50.first,&local_18);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
    if (!bVar1) {
      testing::Message::Message(local_68);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/centroid_test.cpp"
                 ,0x3d,message);
      testing::internal::AssertHelper::operator=(&local_70,local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::Message::~Message(local_68);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(FIND, CountsAll) {
	int runs = 50, size = 100;
	rep(i, 0, runs) {
		Graph G = gen_tree(size);
		EXPECT_EQ(_find_centroid(G, rand() % size, -1, 0).first, size);
	}
}